

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_export_ostream.cpp
# Opt level: O1

void __thiscall OStream_Span_Test::~OStream_Span_Test(OStream_Span_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST (OStream, Span) {
    test_ostream str;

    testing::InSequence seq;
    EXPECT_CALL (
        str, flush_buffer (testing::Truly (first_elements_are{"abc"s}), test_ostream::buffer_size));
    EXPECT_CALL (str, flush_buffer (testing::Truly (first_elements_are{"d"s}), std::size_t{1}));

    std::array<char const, 4U> const v{{'a', 'b', 'c', 'd'}};
    str.write (pstore::gsl::make_span (v));
    str.flush ();
}